

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

double __thiscall
CEPlanet::EccentricAnomoly(CEPlanet *this,double *M,double *e,double *En,double *del_E)

{
  _func_int **pp_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *in_RCX;
  double *in_RDX;
  CEPlanet *in_RSI;
  long in_RDI;
  double *in_R8;
  double *del_E_00;
  double local_8;
  
  pp_Var1 = (in_RSI->super_CEBody).super_CESkyCoord._vptr_CESkyCoord;
  dVar2 = *in_RCX;
  dVar3 = *in_RDX;
  dVar4 = sin(*in_RCX * 0.017453292519943295);
  del_E_00 = (double *)((double)pp_Var1 - (-(dVar3 * 57.29577951308232) * dVar4 + dVar2));
  dVar2 = *in_RDX;
  dVar3 = cos(*in_RCX * 0.017453292519943295);
  *in_R8 = (double)del_E_00 / (-dVar2 * dVar3 + 1.0);
  if (*(double *)(in_RDI + 0x118) <= ABS(*in_R8)) {
    *in_RCX = *in_R8 + *in_RCX;
    local_8 = EccentricAnomoly(in_RSI,in_RDX,in_RCX,in_R8,del_E_00);
  }
  else {
    local_8 = *in_RCX;
  }
  return local_8;
}

Assistant:

double CEPlanet::EccentricAnomoly(double& M,
                                  double& e,
                                  double& En,
                                  double& del_E) const
{
    // Note that because this method is called recursively, no
    // variables should be created inside of this method
    
    // compute del_E
    del_E = (M - (En - e*DR2D*std::sin(En*DD2R))) / (1.0-e*std::cos(En*DD2R)) ;

    // If the change is less than the tolerance, we're all good!
    if ( std::fabs(del_E) < E_tol) {
        return En ;
    }
    // If not, then do another iteration
    else {
        En += del_E ;
        return EccentricAnomoly(M, e, En, del_E) ;
    }
}